

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_gen.h
# Opt level: O0

void __thiscall
IntegerRandomGenerator::IntegerRandomGenerator
          (IntegerRandomGenerator *this,vector<double,_std::allocator<double>_> *distribution,
          vector<int,_std::allocator<int>_> *values)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  invalid_argument *this_00;
  reference pdVar4;
  reference piVar5;
  int local_7c;
  iterator iStack_78;
  int x_i;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  double p_i;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  size_t size_val;
  size_t size_dist;
  vector<int,_std::allocator<int>_> *values_local;
  vector<double,_std::allocator<double>_> *distribution_local;
  IntegerRandomGenerator *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->mDist);
  std::vector<int,_std::allocator<int>_>::vector(&this->mValues);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(distribution);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(values);
  if (sVar2 != sVar3) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"distribution and values vectors shall have the same length");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __end2 = std::vector<double,_std::allocator<double>_>::begin(distribution);
  p_i = (double)std::vector<double,_std::allocator<double>_>::end(distribution);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&p_i);
    if (!bVar1) break;
    pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end2);
    __range2_1 = (vector<int,_std::allocator<int>_> *)*pdVar4;
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->mDist,(value_type_conflict2 *)&__range2_1);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end2);
  }
  __end2_1 = std::vector<int,_std::allocator<int>_>::begin(values);
  iStack_78 = std::vector<int,_std::allocator<int>_>::end(values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2_1,&stack0xffffffffffffff88);
    if (!bVar1) break;
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end2_1);
    local_7c = *piVar5;
    std::vector<int,_std::allocator<int>_>::push_back(&this->mValues,&local_7c);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2_1);
  }
  return;
}

Assistant:

IntegerRandomGenerator(std::vector<double> distribution, std::vector<int> values)
    {
        size_t size_dist = distribution.size();
        size_t size_val  = values.size();
        if( size_dist != size_val )
        {
            throw std::invalid_argument("distribution and values vectors shall have the same length");
        }
        else
        {
            for( double p_i : distribution )
            {
                mDist.push_back(p_i);
            }
            for( int x_i : values )
            {
                mValues.push_back(x_i);
            }
        }
    }